

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp-inl.h
# Opt level: O3

void __thiscall
wabt::interp::FreeList<wabt::interp::Object_*>::Delete
          (FreeList<wabt::interp::Object_*> *this,Index index)

{
  Object *pOVar1;
  pointer ppOVar2;
  
  ppOVar2 = (this->list_).
            super__Vector_base<wabt::interp::Object_*,_std::allocator<wabt::interp::Object_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  pOVar1 = ppOVar2[index];
  if (((ulong)pOVar1 & 1) == 0) {
    if (pOVar1 != (Object *)0x0) {
      (*pOVar1->_vptr_Object[1])();
      ppOVar2 = (this->list_).
                super__Vector_base<wabt::interp::Object_*,_std::allocator<wabt::interp::Object_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
    }
    ppOVar2[index] = (Object *)(this->free_head_ * 2 + 1);
    this->free_head_ = index + 1;
    this->free_items_ = this->free_items_ + 1;
    return;
  }
  __assert_fail("IsUsed(index)",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/include/wabt/interp/interp-inl.h"
                ,0xd6,
                "void wabt::interp::FreeList<wabt::interp::Object *>::Delete(Index) [T = wabt::interp::Object *]"
               );
}

Assistant:

void FreeList<T>::Delete(Index index) {
  assert(IsUsed(index));

  delete list_[index];
  list_[index] = reinterpret_cast<T>((free_head_ << ptrFreeShift) | ptrFreeBit);
  free_head_ = index + 1;
  free_items_++;
}